

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

int main(int argc,char **argv)

{
  Benchmark *b;
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int siz;
  int nthread;
  ulong uVar8;
  bool bVar9;
  StringPiece local_120;
  RE2 local_110;
  
  if (0 < nbenchmarks) {
    lVar6 = 0;
    do {
      b = benchmarks[lVar6];
      if (argc == 1) {
LAB_0012b249:
        iVar5 = b->threadhi;
        if (b->threadlo <= iVar5) {
          iVar2 = b->hi;
          nthread = b->threadlo;
          do {
            siz = b->lo;
            iVar7 = 1;
            if (1 < iVar2) {
              iVar7 = iVar2;
            }
            if (siz <= iVar7) {
              if (siz < 2) {
                siz = 1;
              }
              do {
                RunBench(b,nthread,siz);
                siz = siz * 2;
                iVar2 = b->hi;
                iVar5 = 1;
                if (1 < iVar2) {
                  iVar5 = iVar2;
                }
              } while (siz <= iVar5);
              iVar5 = b->threadhi;
            }
            bVar9 = nthread < iVar5;
            nthread = nthread + 1;
          } while (bVar9);
        }
      }
      else if (1 < argc) {
        __s = b->name;
        bVar9 = true;
        uVar8 = 2;
        do {
          if (__s == (char *)0x0) {
            iVar5 = 0;
          }
          else {
            sVar3 = strlen(__s);
            iVar5 = (int)sVar3;
          }
          re2::RE2::RE2(&local_110,argv[uVar8 - 1]);
          local_120.ptr_ = __s;
          local_120.length_ = iVar5;
          bVar1 = re2::RE2::PartialMatchN(&local_120,&local_110,(Arg **)0x0,0);
          re2::RE2::~RE2(&local_110);
          if (bVar1) break;
          bVar9 = uVar8 < (uint)argc;
          lVar4 = (1 - (ulong)(uint)argc) + uVar8;
          uVar8 = uVar8 + 1;
        } while (lVar4 != 1);
        if (bVar9) goto LAB_0012b249;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < nbenchmarks);
  }
  return 0;
}

Assistant:

int main(int argc, const char** argv) {
	for(int i = 0; i < nbenchmarks; i++) {
		Benchmark* b = benchmarks[i];
		if(match(b->name, argc, argv))
			for(int j = b->threadlo; j <= b->threadhi; j++)
				for(int k = max(b->lo, 1); k <= max(b->hi, 1); k<<=1)
					RunBench(b, j, k);
	}
}